

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::BinaryExpression::serializeTo(BinaryExpression *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  Expression *pEVar2;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  BinaryExpression *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"op");
  local_38 = ast::toString(this->op);
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,local_38._M_len);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"left");
  pEVar2 = left(this);
  ASTSerializer::write(pAVar1,(int)local_48._M_len,local_48._M_str,(size_t)pEVar2);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"right");
  pEVar2 = right(this);
  ASTSerializer::write(pAVar1,(int)local_58._M_len,local_58._M_str,(size_t)pEVar2);
  return;
}

Assistant:

void BinaryExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("left", left());
    serializer.write("right", right());
}